

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildReplicator(ObjectModelBuilder *this,object *object,Class *clazz)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  double *pdVar4;
  ostream *poVar5;
  string local_2a0;
  string local_280;
  Value local_260;
  Value local_220;
  value *local_1e0;
  value *countValue;
  allocator local_1c9;
  key_type local_1c8;
  _Self local_1a8;
  const_iterator countIt;
  Replicator r;
  string parentName;
  undefined1 local_98 [8];
  string className;
  string local_68;
  undefined1 local_48 [8];
  string id;
  Class *clazz_local;
  object *object_local;
  ObjectModelBuilder *this_local;
  
  id.field_2._8_8_ = clazz;
  findStringInObject(&local_68,object,"id");
  uniqueIdentifier((string *)local_48,this,clazz,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  findStringInObject((string *)local_98,object,"class");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "error: \'replciator\' missing \'class\' tag, id=");
    poVar5 = std::operator<<(poVar5,(string *)local_48);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
    goto LAB_00131641;
  }
  findStringInObject((string *)((long)&r.terminator.field_2 + 8),object,"parent");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Replicator::Replicator((Replicator *)&countIt);
    std::__cxx11::string::operator=((string *)&countIt,(string *)local_48);
    std::__cxx11::string::operator=((string *)(r.id.field_2._M_local_buf + 8),(string *)local_98);
    std::__cxx11::string::operator=
              ((string *)(r.clazz.field_2._M_local_buf + 8),
               (string *)(r.terminator.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"count",&local_1c9);
    local_1a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         ::find(object,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    countValue = (value *)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                          ::end(object);
    bVar1 = std::operator!=(&local_1a8,(_Self *)&countValue);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
               ::operator->(&local_1a8);
      local_1e0 = &ppVar3->second;
      bVar1 = picojson::value::is<double>(local_1e0);
      if (bVar1) {
        pdVar4 = picojson::value::get<double>(local_1e0);
        Value::number(&local_220,*pdVar4);
        Value::operator=((Value *)((long)&r.parentId.field_2 + 8),&local_220);
        Value::~Value(&local_220);
        goto LAB_0013145b;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"error: malformed value for replicator id=");
      poVar5 = std::operator<<(poVar5,(string *)local_48);
      poVar5 = std::operator<<(poVar5,", in class=");
      poVar5 = std::operator<<(poVar5,(string *)local_98);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      Value::number(&local_260,0.0);
      Value::operator=((Value *)((long)&r.parentId.field_2 + 8),&local_260);
      Value::~Value(&local_260);
LAB_0013145b:
      findStringInObject(&local_280,object,"initializor");
      std::__cxx11::string::operator=((string *)&r.count.type,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      findStringInObject(&local_2a0,object,"terminator");
      std::__cxx11::string::operator=
                ((string *)(r.initializor.field_2._M_local_buf + 8),(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      if ((this->m_verbose & 1U) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr," - replicator, id=");
        poVar5 = std::operator<<(poVar5,(string *)local_48);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,(double)r.count.stringValue.field_2._8_8_);
        poVar5 = std::operator<<(poVar5,"x \'");
        poVar5 = std::operator<<(poVar5,(string *)local_98);
        poVar5 = std::operator<<(poVar5,"\' under parent=");
        poVar5 = std::operator<<(poVar5,(string *)(r.terminator.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      std::vector<Replicator,_std::allocator<Replicator>_>::push_back
                ((vector<Replicator,_std::allocator<Replicator>_> *)(id.field_2._8_8_ + 0xc0),
                 (value_type *)&countIt);
      this_local._7_1_ = true;
    }
    Replicator::~Replicator((Replicator *)&countIt);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "error: \'replciator\' missing \'parent\' tag, id=");
    poVar5 = std::operator<<(poVar5,(string *)local_48);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)(r.terminator.field_2._M_local_buf + 8));
LAB_00131641:
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool ObjectModelBuilder::buildReplicator(const picojson::object &object, Class *clazz)
{
    std::string id = uniqueIdentifier(clazz, findStringInObject(object, "id"));
    std::string className = findStringInObject(object, "class");
    if (className.empty()) {
        std::cerr << "error: 'replciator' missing 'class' tag, id=" << id << std::endl;
        return false;
    }
    std::string parentName = findStringInObject(object, "parent");
    if (parentName.empty()) {
        std::cerr << "error: 'replciator' missing 'parent' tag, id=" << id << std::endl;
        return false;
    }

    Replicator r;
    r.id = id;
    r.clazz = className;
    r.parentId = parentName;

    auto countIt = object.find("count");
    if (countIt != object.end()) {
        const picojson::value &countValue = countIt->second;
        if (countValue.is<double>()) {
            r.count = Value::number(countValue.get<double>());
        } else {
            std::cerr << "error: malformed value for replicator id=" << id << ", in class=" << className << std::endl;
            return false;
        }
    } else {
        r.count = Value::number(0);
    }

    r.initializor = findStringInObject(object, "initializor");
    r.terminator = findStringInObject(object, "terminator");

    if (m_verbose) {
        std::cerr << " - replicator, id=" << id << ": " << r.count.numberValue << "x '" << className << "' under parent=" << parentName << std::endl;
    }

    clazz->replicators.push_back(r);

    return true;
}